

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O0

int __thiscall jrtplib::RTPTCPTransmitter::Init(RTPTCPTransmitter *this,bool tsafe)

{
  bool tsafe_local;
  RTPTCPTransmitter *this_local;
  
  if ((this->m_init & 1U) == 0) {
    if (tsafe) {
      this_local._4_4_ = -2;
    }
    else {
      this->m_maxPackSize = 0xffff;
      this->m_init = true;
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ = -0xb6;
  }
  return this_local._4_4_;
}

Assistant:

int RTPTCPTransmitter::Init(bool tsafe)
{
	if (m_init)
		return ERR_RTP_TCPTRANS_ALREADYINIT;
	
#ifdef RTP_SUPPORT_THREAD
	m_threadsafe = tsafe;
	if (m_threadsafe)
	{
		int status;
		
		status = m_mainMutex.Init();
		if (status < 0)
			return ERR_RTP_TCPTRANS_CANTINITMUTEX;
		status = m_waitMutex.Init();
		if (status < 0)
			return ERR_RTP_TCPTRANS_CANTINITMUTEX;
	}
#else
	if (tsafe)
		return ERR_RTP_NOTHREADSUPPORT;
#endif // RTP_SUPPORT_THREAD

	m_maxPackSize = RTPTCPTRANS_MAXPACKSIZE;
	m_init = true;
	return 0;
}